

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O3

void __thiscall OpenSketch<4U>::heap_up(OpenSketch<4U> *this,int i)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  mapped_type mVar4;
  KV<4U> *pKVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  int __tmp;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (1 < i) {
    uVar11 = (ulong)(uint)i;
    do {
      uVar8 = (int)uVar11 - 1;
      uVar12 = (ulong)(uVar8 >> 1);
      pKVar5 = this->heap;
      iVar1 = pKVar5[uVar11].first;
      iVar2 = pKVar5[uVar12].first;
      if (iVar2 <= iVar1) {
        if (iVar2 < iVar1) {
          return;
        }
        uVar9 = swap_bytes(*(undefined4 *)pKVar5[uVar11].second.str);
        uVar10 = swap_bytes(*(undefined4 *)pKVar5[uVar12].second.str);
        if (-1 < (int)((uint)(uVar9 >= uVar10 && uVar9 != uVar10) - (uint)(uVar9 < uVar10))) {
          return;
        }
      }
      pKVar5[uVar11].first = iVar2;
      pKVar5[uVar12].first = iVar1;
      uVar3 = *(undefined4 *)pKVar5[uVar11].second.str;
      *(undefined4 *)pKVar5[uVar11].second.str = *(undefined4 *)pKVar5[uVar12].second.str;
      *(undefined4 *)pKVar5[uVar12].second.str = uVar3;
      pmVar6 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->mp,&this->heap[uVar11].second);
      pmVar7 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->mp,&this->heap[uVar12].second);
      mVar4 = *pmVar6;
      *pmVar6 = *pmVar7;
      *pmVar7 = mVar4;
      uVar11 = uVar12;
    } while (3 < uVar8);
  }
  return;
}

Assistant:

void heap_up(int i) {
		while (i > 1) {
			int parent = (i - 1) / 2;
			if (heap[parent] <= heap[i]) {
				break;
			}
			swap(heap[i], heap[parent]);
			swap(mp[heap[i].second], mp[heap[parent].second]);
			i = parent;
		}
	}